

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  int iVar2;
  GroupInfo local_d0;
  TestGroupStats local_a0;
  
  pIVar1 = (this->m_reporter).m_p;
  std::__cxx11::string::string((string *)&local_d0,(string *)testSpec);
  local_d0.groupIndex = groupIndex;
  local_d0.groupsCounts = groupsCount;
  iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])(this);
  TestGroupStats::TestGroupStats(&local_a0,&local_d0,totals,SUB41(iVar2,0));
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar1,&local_a0);
  TestGroupStats::~TestGroupStats(&local_a0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }